

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testInt64OutOfBoundsHigh_Test::atoiTest_testInt64OutOfBoundsHigh_Test
          (atoiTest_testInt64OutOfBoundsHigh_Test *this)

{
  atoiTest_testInt64OutOfBoundsHigh_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__atoiTest_testInt64OutOfBoundsHigh_Test_001b1e38;
  return;
}

Assistant:

TEST(atoiTest, testInt64OutOfBoundsHigh) {
  // out of bounds
  test<int64_t>(false, "9223372036854775808"); 
  test<int64_t>(false, "9223372036854775809"); 
  test<int64_t>(false, "18446744073709551610");
  test<int64_t>(false, "18446744073709551614");
  test<int64_t>(false, "18446744073709551615");
  test<int64_t>(false, "18446744073709551616");
  test<int64_t>(false, "118446744073709551612");
  test<int64_t>(false, "111111111111111111111111111111");
  test<int64_t>(false, "11111111111111111111111111111111111111111111111111111111111111111");
}